

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

_Bool CrawlSpaces(Lexer *lexer)

{
  char cVar1;
  _Bool _Var2;
  char *checkCharacters;
  char nextChar;
  char currentChar;
  Lexer *lexer_local;
  
  cVar1 = GetCurrentCharacter(lexer);
  if (cVar1 == ' ') {
    checkCharacters._6_1_ = PeekNextCharacter(lexer);
    while( true ) {
      _Var2 = IsCharacter(checkCharacters._6_1_," \n\r");
      if (!_Var2) break;
      if (checkCharacters._6_1_ == '\n') {
        (lexer->tracker).row = (lexer->tracker).row + 1;
        (lexer->tracker).col = 1;
      }
      checkCharacters._6_1_ = PeekNextCharacter(lexer);
      GetNextCharacter(lexer);
    }
    GetNextCharacter(lexer);
    lexer_local._7_1_ = true;
  }
  else {
    lexer_local._7_1_ = false;
  }
  return lexer_local._7_1_;
}

Assistant:

bool CrawlSpaces(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	if (currentChar == ' '){
		char nextChar = PeekNextCharacter(lexer);
		char* checkCharacters = " \n\r";
		while (IsCharacter(nextChar, checkCharacters)){
			if (nextChar == '\n'){
				lexer->tracker.row++;
				lexer->tracker.col = 1;
			}

			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
		}
		GetNextCharacter(lexer);
		return true;
	}
	return false;
}